

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name,
          bool cap_first_letter)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_28;
  byte local_21;
  int i;
  bool cap_first_letter_local;
  string_view name_local;
  string *result;
  
  name_local._M_len = name._M_len;
  local_21 = (byte)name._M_str & 1;
  _i = this;
  name_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0;
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&i),
      (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
    if ((*pvVar2 < 'a') ||
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28),
       'z' < *pvVar2)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
      if ((*pvVar2 < 'A') ||
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
         , 'Z' < *pvVar2)) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        if (('/' < *pvVar2) &&
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                                (long)local_28), *pvVar2 < ':')) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
          ;
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        }
        local_21 = 1;
      }
      else {
        if ((local_28 == 0) && (local_21 == 0)) {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,0);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2 + ' ');
        }
        else {
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28)
          ;
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
        }
        local_21 = 0;
      }
    }
    else {
      if (local_21 == 0) {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2);
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&i,(long)local_28);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pvVar2 + -0x20);
      }
      local_21 = 0;
    }
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&i);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                     ((basic_string_view<char,_std::char_traits<char>_> *)&i,sVar1 - 1);
  if (*pvVar2 == '#') {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoresToCamelCase(absl::string_view name,
                                   bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}